

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eltcalc.cpp
# Opt level: O2

void eltcalc::GetEventRates(FILE *fin)

{
  double dVar1;
  int iVar2;
  char *pcVar3;
  mapped_type *pmVar4;
  uint uVar5;
  EventRates row;
  char line [4096];
  
  fgets(line,0x1000,(FILE *)fin);
  uVar5 = 2;
  while( true ) {
    pcVar3 = fgets(line,0x1000,(FILE *)fin);
    if (pcVar3 == (char *)0x0) {
      fclose((FILE *)fin);
      return;
    }
    iVar2 = __isoc99_sscanf(line,"%d,%lf",&row,&row.event_rate);
    dVar1 = row.event_rate;
    if (iVar2 != 2) break;
    pmVar4 = std::map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>::
             operator[]((map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
                         *)event_rate_,&row.event_id);
    *pmVar4 = dVar1;
    uVar5 = uVar5 + 1;
  }
  fprintf(_stderr,"FATAL: Invalid data in line %d:\n%s",(ulong)uVar5,line);
  exit(1);
}

Assistant:

void GetEventRates(FILE * fin)
	{
		// Extract event rates from event rates file
		char line[4096];
		EventRates row;
		fgets(line, sizeof(line), fin);   // Read header
		int lineno = 2;
		while (fgets(line, sizeof(line), fin) != 0) {
			int ret = sscanf(line, "%d,%lf", &row.event_id,
					 &row.event_rate);
			if (ret == 2) {
				event_rate_[row.event_id] = row.event_rate;
			} else {
				fprintf(stderr, "FATAL: Invalid data in line %d:\n%s",
					lineno, line);
				exit(EXIT_FAILURE);
			}
			lineno++;
		}
		fclose(fin);
	}